

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall String::join(String *this,List<String> *tokens,char separator)

{
  Item *pIVar1;
  Item *str;
  
  clear(this);
  if ((tokens->endItem).prev != (Item *)0x0) {
    pIVar1 = (tokens->_end).item;
    str = (tokens->_begin).item;
    while( true ) {
      append(this,&str->value);
      str = str->next;
      if (str == pIVar1) break;
      append(this,separator);
    }
  }
  return this;
}

Assistant:

String& String::join(const List<String>& tokens, char separator)
{
  clear();
  if(!tokens.isEmpty())
    for(List<String>::Iterator i = tokens.begin(), end = tokens.end();;)
    {
      append(*i);
      if(++i == end)
        break;
      append(separator);
    }
  return *this;
}